

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O0

int Bmc_FxComputeOne(Gia_Man_t *p,int nIterMax,int nDiv2Add)

{
  int nVars;
  int iCiVarBeg_00;
  int iVar1;
  int iVar2;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Wec_t *vCubes_00;
  Vec_Int_t *vVars;
  Vec_Int_t *vDivs_00;
  Vec_Int_t *vDivs;
  Vec_Int_t *vVar2Sat;
  Vec_Wec_t *vCubes;
  int iAuxVarStart;
  int RetValue;
  int Iter;
  int n;
  int iCiVarCur;
  int iCiVarBeg;
  int nCiVars;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  int Extra;
  int nDiv2Add_local;
  int nIterMax_local;
  Gia_Man_t *p_local;
  
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  nVars = Gia_ManCiNum(p);
  iCiVarBeg_00 = p_00->nVars - nVars;
  Iter = iCiVarBeg_00 + nVars;
  iVar1 = sat_solver_nvars(s);
  sat_solver_setnvars(s,iVar1 + 0x3e9 + nIterMax);
  iAuxVarStart = 0;
  while( true ) {
    if (nIterMax <= iAuxVarStart) {
      sat_solver_delete(s);
      Cnf_DataFree(p_00);
      return 1;
    }
    vCubes_00 = Vec_WecAlloc(1000);
    vVars = Vec_IntAlloc(Iter - iCiVarBeg_00);
    for (RetValue = iCiVarBeg_00; RetValue < Iter; RetValue = RetValue + 1) {
      Vec_IntPush(vVars,RetValue);
    }
    printf("\nIteration %d (Aux = %d)\n",(ulong)(uint)iAuxVarStart,
           (ulong)(uint)(iVar1 + 1000 + iAuxVarStart));
    iVar2 = Bmc_FxSolve(s,0,iVar1 + 1000 + iAuxVarStart,vVars,1,1,(int *)0x0,vCubes_00);
    if (iVar2 == 0) {
      printf("Mismatch\n");
    }
    if (iVar2 == -1) {
      printf("Timeout\n");
    }
    vDivs_00 = Div_CubePairs(vCubes_00,nVars,nDiv2Add);
    Vec_WecFree(vCubes_00);
    Bmc_FxAddClauses(s,vDivs_00,iCiVarBeg_00,Iter);
    iVar2 = Vec_IntSize(vDivs_00);
    Iter = iVar2 / 4 + Iter;
    Vec_IntFree(vDivs_00);
    iVar2 = Vec_IntSize(vVars);
    if (nVars + 1000 < iVar2) break;
    Vec_IntFree(vVars);
    iAuxVarStart = iAuxVarStart + 1;
  }
  __assert_fail("Vec_IntSize(vVar2Sat) <= nCiVars + Extra",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFx.c"
                ,0x2c5,"int Bmc_FxComputeOne(Gia_Man_t *, int, int)");
}

Assistant:

int Bmc_FxComputeOne( Gia_Man_t * p, int nIterMax, int nDiv2Add )
{
    int Extra    = 1000;
    // create SAT solver
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    // compute parameters
    int nCiVars   = Gia_ManCiNum(p);             // PI count
    int iCiVarBeg = pCnf->nVars - nCiVars;//- 1;   // first PI var
    int iCiVarCur = iCiVarBeg + nCiVars;         // current unused PI var
    int n, Iter, RetValue;
    // create variables
    int iAuxVarStart = sat_solver_nvars(pSat) + Extra; // the aux var
    sat_solver_setnvars( pSat, iAuxVarStart + 1 + nIterMax );
    for ( Iter = 0; Iter < nIterMax; Iter++ )
    {
        Vec_Wec_t * vCubes = Vec_WecAlloc( 1000 );
        // collect variables
        Vec_Int_t * vVar2Sat = Vec_IntAlloc( iCiVarCur-iCiVarBeg ), * vDivs;
//        for ( n = iCiVarCur - 1; n >= iCiVarBeg; n-- )
        for ( n = iCiVarBeg; n < iCiVarCur; n++ )
            Vec_IntPush( vVar2Sat, n );
        // iterate through outputs
        printf( "\nIteration %d (Aux = %d)\n", Iter, iAuxVarStart + Iter );
        RetValue = Bmc_FxSolve( pSat, 0, iAuxVarStart + Iter, vVar2Sat, 1, 1, NULL, vCubes );
        if ( RetValue == 0 )
            printf( "Mismatch\n" );
        if ( RetValue == -1 )
            printf( "Timeout\n" );
        // print cubes
        //Div_CubePrint( vCubes, nCiVars );
        vDivs = Div_CubePairs( vCubes, nCiVars, nDiv2Add );
        Vec_WecFree( vCubes );
        // add clauses and update variables
        Bmc_FxAddClauses( pSat, vDivs, iCiVarBeg, iCiVarCur );
        iCiVarCur += Vec_IntSize(vDivs)/4;
        Vec_IntFree( vDivs );
        // cleanup
        assert( Vec_IntSize(vVar2Sat) <= nCiVars + Extra );
        Vec_IntFree( vVar2Sat );
    }
    // cleanup
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    return 1;
}